

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::search(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint src;
  uint uVar2;
  uint src_00;
  size_type sVar3;
  string Word2;
  string Word1;
  
  requireDStackDepth(this,4,"SEARCH");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  src_00 = ForthStack<unsigned_int>::getTop(this_00,2);
  Word1._M_dataplus._M_p = (pointer)&Word1.field_2;
  Word1._M_string_length = 0;
  Word1.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&Word1,src_00,(ulong)uVar2);
  Word2._M_dataplus._M_p = (pointer)&Word2.field_2;
  Word2._M_string_length = 0;
  Word2.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&Word2,src,(ulong)uVar1);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&Word1,&Word2,0);
  if (sVar3 == 0xffffffffffffffff) {
    ForthStack<unsigned_int>::setTop(this_00,this->False);
  }
  else {
    ForthStack<unsigned_int>::setTop(this_00,this->True);
    ForthStack<unsigned_int>::setTop(this_00,1,uVar2 - (int)sVar3);
    ForthStack<unsigned_int>::setTop(this_00,2,src_00 + (int)sVar3);
  }
  std::__cxx11::string::~string((string *)&Word2);
  std::__cxx11::string::~string((string *)&Word1);
  return;
}

Assistant:

void search(){
			REQUIRE_DSTACK_DEPTH(4, "SEARCH");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); 
			auto length1 = dStack.getTop(1); 
			auto caddr1 = CADDR(dStack.getTop(2)); 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{};
			moveFromDataSpace(Word2, caddr2, length2);
			auto result = Word1.find(Word2,0);
			if(result!=std::string::npos){
				dStack.setTop(True);
				dStack.setTop(1,length1-CELL(result));
				dStack.setTop(2,caddr1+CELL(result));

			} else {
				dStack.setTop(False);
				// dStack.setTop(1,length1); // not changed
				// dStack.setTop(2,caddr1);	 // not changed
			}
			
		}